

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

DSA * d2i_DSA_PUBKEY(DSA **a,uchar **pp,long length)

{
  bool bVar1;
  EVP_PKEY *__p;
  EVP_PKEY *pkey_00;
  dsa_st *__p_00;
  DSA *pDVar2;
  uint8_t *puVar3;
  unique_ptr<dsa_st,_bssl::internal::Deleter> local_50;
  UniquePtr<DSA> dsa;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_40;
  UniquePtr<EVP_PKEY> pkey;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  DSA **out_local;
  
  if (length < 0) {
    out_local = (DSA **)0x0;
  }
  else {
    CBS_init((CBS *)&pkey,*pp,length);
    __p = EVP_parse_public_key((CBS *)&pkey);
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_40,__p);
    bVar1 = std::operator==(&local_40,(nullptr_t)0x0);
    if (bVar1) {
      out_local = (DSA **)0x0;
      dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl._4_4_ = 1;
    }
    else {
      pkey_00 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_40);
      __p_00 = EVP_PKEY_get1_DSA(pkey_00);
      std::unique_ptr<dsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<dsa_st,bssl::internal::Deleter> *)&local_50,(pointer)__p_00);
      bVar1 = std::operator==(&local_50,(nullptr_t)0x0);
      if (bVar1) {
        out_local = (DSA **)0x0;
      }
      else {
        if (a != (DSA **)0x0) {
          DSA_free(*a);
          pDVar2 = (DSA *)std::unique_ptr<dsa_st,_bssl::internal::Deleter>::get(&local_50);
          *a = pDVar2;
        }
        puVar3 = CBS_data((CBS *)&pkey);
        *pp = puVar3;
        out_local = (DSA **)std::unique_ptr<dsa_st,_bssl::internal::Deleter>::release(&local_50);
      }
      dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl._4_4_ = 1;
      std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  }
  return (DSA *)out_local;
}

Assistant:

DSA *d2i_DSA_PUBKEY(DSA **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<DSA> dsa(EVP_PKEY_get1_DSA(pkey.get()));
  if (dsa == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    DSA_free(*out);
    *out = dsa.get();
  }
  *inp = CBS_data(&cbs);
  return dsa.release();
}